

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O1

Vec4 rr::resolveMultisamplePixel(MultisampleConstPixelBufferAccess *access,int x,int y)

{
  int i;
  int iVar1;
  long lVar2;
  undefined4 in_register_00000034;
  int y_00;
  Vec4 VVar3;
  Vec4 sum;
  float local_58 [6];
  float local_40 [4];
  
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  iVar1 = *(int *)(CONCAT44(in_register_00000034,x) + 8);
  if (0 < iVar1) {
    y_00 = 0;
    do {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_40,x,y_00,y);
      lVar2 = 0;
      do {
        local_58[lVar2] = local_40[lVar2] + local_58[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      y_00 = y_00 + 1;
      iVar1 = *(int *)(CONCAT44(in_register_00000034,x) + 8);
    } while (y_00 < iVar1);
  }
  VVar3.m_data[0] = (float)iVar1;
  (access->m_access).m_format.order = R;
  (access->m_access).m_format.type = SNORM_INT8;
  (access->m_access).m_size.m_data[0] = 0;
  (access->m_access).m_size.m_data[1] = 0;
  lVar2 = 0;
  do {
    VVar3.m_data[2] = local_58[lVar2] / VVar3.m_data[0];
    (access->m_access).m_size.m_data[lVar2 + -2] = (int)VVar3.m_data[2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  VVar3.m_data[1] = 0.0;
  VVar3.m_data[3] = 0.0;
  return (Vec4)VVar3.m_data;
}

Assistant:

tcu::Vec4 resolveMultisamplePixel (const MultisampleConstPixelBufferAccess& access, int x, int y)
{
	tcu::Vec4 sum;
	for (int s = 0; s < access.getNumSamples(); s++)
		sum += access.raw().getPixel(s, x, y);

	return sum / (float)access.getNumSamples();
}